

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

void EMIT_OP_REG_REG(CodeGenGenericContext *ctx,x86Command op,x86XmmReg reg1,x86Reg reg2)

{
  x86Instruction *pxVar1;
  
  if ((op != o_cvtsi2sd64) && (op != o_cvtsi2sd)) {
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x5b5,
                  "void EMIT_OP_REG_REG(CodeGenGenericContext &, x86Command, x86XmmReg, x86Reg)");
  }
  if (ctx->genReg[reg2].type == argReg) {
    reg2 = ctx->genReg[reg2].field_1.reg;
  }
  ctx->genRegRead[reg2] = true;
  CodeGenGenericContext::OverwriteRegisterWithUnknown(ctx,reg1);
  pxVar1 = ctx->x86Op;
  pxVar1->name = op;
  (pxVar1->argA).type = argXmmReg;
  (pxVar1->argA).field_1.xmmArg = reg1;
  pxVar1 = ctx->x86Op;
  (pxVar1->argB).type = argReg;
  (pxVar1->argB).field_1.reg = reg2;
  ctx->x86Op = ctx->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_REG_REG(CodeGenGenericContext &ctx, x86Command op, x86XmmReg reg1, x86Reg reg2)
{
#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_cvtsi2sd:
	case o_cvtsi2sd64:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);
		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argXmmReg;
	ctx.x86Op->argA.xmmArg = reg1;
	ctx.x86Op->argB.type = x86Argument::argReg;
	ctx.x86Op->argB.reg = reg2;
	ctx.x86Op++;
}